

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ancientzip.cpp
# Opt level: O1

int __thiscall
FZipExploder::DecodeSF
          (FZipExploder *this,TArray<FZipExploder::HuffNode,_FZipExploder::HuffNode> *decoder,
          int numvals)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  bool bVar10;
  TableBuilder builder [256];
  TableBuilder local_438 [258];
  
  if (this->InLeft == 0) {
    bVar1 = 0;
  }
  else {
    this->InLeft = this->InLeft - 1;
    uVar3 = this->bs;
    if (uVar3 < this->be) {
      this->bs = uVar3 + 1;
      bVar1 = this->ReadBuf[uVar3];
    }
    else {
      uVar3 = (*(this->In->super_FileReaderBase)._vptr_FileReaderBase[2])
                        (this->In,this->ReadBuf,0x100);
      this->be = uVar3;
      bVar1 = this->ReadBuf[0];
      this->bs = 1;
    }
  }
  lVar8 = 0;
  uVar3 = 0;
  do {
    if (this->InLeft == 0) {
      bVar2 = 0;
    }
    else {
      this->InLeft = this->InLeft - 1;
      uVar4 = this->bs;
      if (uVar4 < this->be) {
        this->bs = uVar4 + 1;
        bVar2 = this->ReadBuf[uVar4];
      }
      else {
        uVar4 = (*(this->In->super_FileReaderBase)._vptr_FileReaderBase[2])
                          (this->In,this->ReadBuf,0x100);
        this->be = uVar4;
        bVar2 = this->ReadBuf[0];
        this->bs = 1;
      }
    }
    iVar9 = (int)lVar8;
    lVar7 = (long)iVar9;
    lVar6 = 0;
    do {
      local_438[lVar7 + lVar6].Length = (bVar2 & 0xf) + 1;
      local_438[lVar7 + lVar6].Value = (char)lVar8 + (char)lVar6;
      lVar6 = lVar6 + 1;
      iVar5 = (int)lVar6;
    } while ((bVar2 >> 4) + 1 != iVar5);
    lVar8 = lVar7 + lVar6;
    bVar10 = uVar3 != bVar1;
    uVar3 = uVar3 + 1;
  } while (bVar10);
  bVar10 = iVar5 + (iVar9 - numvals) != 0;
  if (!bVar10) {
    BuildDecoder(this,decoder,local_438,iVar9 + iVar5);
  }
  return (uint)bVar10;
}

Assistant:

int FZipExploder::DecodeSF(TArray<HuffNode> &decoder, int numvals)
{
	TableBuilder builder[256];
	unsigned char a, c;
	int i, n, v = 0;

	READBYTE(c);
	n = c + 1;
	for (i = 0; i < n; i++) {
		int nv, bl;
		READBYTE(a);
		nv = ((a >> 4) & 15) + 1;
		bl = (a & 15) + 1;
		while (nv--) {
			builder[v].Length = bl;
			builder[v].Value = v;
			v++;
		}
	}
	if (v != numvals)
		return 1;	/* bad table */
	return BuildDecoder(decoder, builder, v);
}